

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void tinyexr::CalculateNumTiles
               (vector<int,_std::allocator<int>_> *numTiles,int toplevel_size,int size,
               int tile_rounding_mode)

{
  pointer piVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    piVar1 = (numTiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(numTiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= (ulong)uVar3) break;
    iVar2 = toplevel_size / (1 << ((byte)uVar3 & 0x1f));
    iVar2 = (uint)(iVar2 << ((byte)uVar3 & 0x1f) < toplevel_size && tile_rounding_mode == 1) + iVar2
    ;
    if (iVar2 < 2) {
      iVar2 = 1;
    }
    piVar1[uVar3] = (iVar2 + size + -1) / size;
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

static void CalculateNumTiles(std::vector<int>& numTiles,
  int toplevel_size,
  int size,
  int tile_rounding_mode) {
  for (unsigned i = 0; i < numTiles.size(); i++) {
    int l = LevelSize(toplevel_size, int(i), tile_rounding_mode);
    assert(l <= std::numeric_limits<int>::max() - size + 1);

    numTiles[i] = (l + size - 1) / size;
  }
}